

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTarget::cmTarget(cmTarget *this,string *name,TargetType type,Visibility vis,cmMakefile *mf,
                  PerConfig perConfig)

{
  cmMakefile *pcVar1;
  PerConfig PVar2;
  Visibility VVar3;
  byte bVar4;
  bool bVar5;
  uint uVar6;
  TargetType TVar7;
  int iVar8;
  pointer pcVar9;
  string *psVar10;
  cmGlobalGenerator *pcVar11;
  const_iterator ppcVar12;
  pointer pcVar13;
  reference pbVar14;
  char *default_value;
  cmState *this_00;
  cmPropertyDefinitionMap *this_01;
  map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>_>
  *this_02;
  ulong uVar15;
  cmBTStringRange cVar16;
  string_view sVar17;
  bool local_237a;
  bool local_1d92;
  bool local_1d45;
  cmValue local_1d20;
  cmValue value;
  pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>
  *prop_1;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>_>
  *__range1;
  string local_1cf0;
  byte local_1ccb;
  byte local_1cca;
  allocator<char> local_1cc9;
  string local_1cc8;
  string local_1ca8 [8];
  string propValue;
  undefined1 local_1c68 [8];
  string propName;
  size_type assignment;
  string *i;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  undefined1 local_1c18 [8];
  string vsGlobal;
  undefined1 local_1be8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  string local_1bc0 [8];
  string genName;
  string local_1b98;
  cmValue local_1b78;
  cmValue globals;
  string local_1b68;
  allocator<char> local_1b41;
  string local_1b40;
  allocator<char> local_1b19;
  string local_1b18;
  allocator<char> local_1af1;
  string local_1af0;
  allocator<char> local_1ac9;
  string local_1ac8;
  allocator<char> local_1aa1;
  string local_1aa0;
  allocator<char> local_1a79;
  string local_1a78;
  allocator<char> local_1a51;
  string local_1a50;
  allocator<char> local_1a29;
  string local_1a28;
  allocator<char> local_1a01;
  string local_1a00;
  cmBTStringRange local_19e0;
  cmBTStringRange local_19d0;
  cmBTStringRange local_19c0;
  _Base_ptr local_19b0;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_19a8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_19a0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *sysInc;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_1990;
  undefined1 local_1988 [24];
  string local_1970;
  string local_1950;
  cmAlphaNum local_1930;
  cmAlphaNum local_1900;
  undefined1 local_18d0 [8];
  string property_2;
  string local_1880;
  cmAlphaNum local_1860;
  undefined1 local_1830 [8];
  string property_1;
  cmAlphaNum local_17e0;
  undefined1 local_17b0 [8];
  string property;
  char **prop;
  const_iterator __end3;
  const_iterator __begin3;
  initializer_list<const_char_*> *__range3;
  string configUpper;
  string *configName;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configNames;
  string local_1710;
  allocator<char> local_16e9;
  string local_16e8;
  allocator<char> local_16c1;
  string local_16c0;
  allocator<char> local_1699;
  string local_1698;
  allocator<char> local_1671;
  string local_1670;
  allocator<char> local_1649;
  string local_1648;
  allocator<char> local_1621;
  string local_1620;
  allocator<char> local_15f9;
  string local_15f8;
  allocator<char> local_15d1;
  string local_15d0;
  allocator<char> local_15a9;
  string local_15a8;
  allocator<char> local_1581;
  string local_1580;
  allocator<char> local_1559;
  string local_1558;
  allocator<char> local_1531;
  string local_1530;
  allocator<char> local_1509;
  string local_1508;
  allocator<char> local_14e1;
  string local_14e0;
  allocator<char> local_14b9;
  string local_14b8;
  allocator<char> local_1491;
  string local_1490;
  allocator<char> local_1469;
  string local_1468;
  allocator<char> local_1441;
  string local_1440;
  allocator<char> local_1419;
  string local_1418;
  allocator<char> local_13f1;
  string local_13f0;
  allocator<char> local_13c9;
  string local_13c8;
  allocator<char> local_13a1;
  string local_13a0;
  allocator<char> local_1379;
  string local_1378;
  allocator<char> local_1351;
  string local_1350;
  allocator<char> local_1329;
  string local_1328;
  allocator<char> local_1301;
  string local_1300;
  allocator<char> local_12d9;
  string local_12d8;
  allocator<char> local_12b1;
  string local_12b0;
  allocator<char> local_1289;
  string local_1288;
  allocator<char> local_1261;
  string local_1260;
  allocator<char> local_1239;
  string local_1238;
  allocator<char> local_1211;
  string local_1210;
  allocator<char> local_11e9;
  string local_11e8;
  allocator<char> local_11c1;
  string local_11c0;
  allocator<char> local_1199;
  string local_1198;
  allocator<char> local_1171;
  string local_1170;
  allocator<char> local_1149;
  string local_1148;
  allocator<char> local_1121;
  string local_1120;
  allocator<char> local_10f9;
  string local_10f8;
  allocator<char> local_10d1;
  string local_10d0;
  allocator<char> local_10a9;
  string local_10a8;
  allocator<char> local_1081;
  string local_1080;
  allocator<char> local_1059;
  string local_1058;
  allocator<char> local_1031;
  string local_1030;
  allocator<char> local_1009;
  string local_1008;
  allocator<char> local_fe1;
  string local_fe0;
  allocator<char> local_fb9;
  string local_fb8;
  allocator<char> local_f91;
  string local_f90;
  allocator<char> local_f69;
  string local_f68;
  allocator<char> local_f41;
  string local_f40;
  allocator<char> local_f19;
  string local_f18;
  allocator<char> local_ef1;
  string local_ef0;
  allocator<char> local_ec9;
  string local_ec8;
  allocator<char> local_ea1;
  string local_ea0;
  allocator<char> local_e79;
  string local_e78;
  allocator<char> local_e51;
  string local_e50;
  allocator<char> local_e29;
  string local_e28;
  allocator<char> local_e01;
  string local_e00;
  allocator<char> local_dd9;
  string local_dd8;
  allocator<char> local_db1;
  string local_db0;
  allocator<char> local_d89;
  string local_d88;
  allocator<char> local_d61;
  string local_d60;
  allocator<char> local_d39;
  string local_d38;
  allocator<char> local_d11;
  string local_d10;
  allocator<char> local_ce9;
  string local_ce8;
  allocator<char> local_cc1;
  string local_cc0;
  allocator<char> local_c99;
  string local_c98;
  allocator<char> local_c71;
  string local_c70;
  allocator<char> local_c49;
  string local_c48;
  allocator<char> local_c21;
  string local_c20;
  allocator<char> local_bf9;
  string local_bf8;
  allocator<char> local_bd1;
  string local_bd0;
  allocator<char> local_ba9;
  string local_ba8;
  allocator<char> local_b81;
  string local_b80;
  allocator<char> local_b59;
  string local_b58;
  allocator<char> local_b31;
  string local_b30;
  allocator<char> local_b09;
  string local_b08;
  allocator<char> local_ae1;
  string local_ae0;
  allocator<char> local_ab9;
  string local_ab8;
  allocator<char> local_a91;
  string local_a90;
  allocator<char> local_a69;
  string local_a68;
  allocator<char> local_a41;
  string local_a40;
  allocator<char> local_a19;
  string local_a18;
  allocator<char> local_9f1;
  string local_9f0;
  allocator<char> local_9c9;
  string local_9c8;
  allocator<char> local_9a1;
  string local_9a0;
  allocator<char> local_979;
  string local_978;
  allocator<char> local_951;
  string local_950;
  allocator<char> local_929;
  string local_928;
  allocator<char> local_901;
  string local_900;
  allocator<char> local_8d9;
  string local_8d8;
  allocator<char> local_8b1;
  string local_8b0;
  allocator<char> local_889;
  string local_888;
  allocator<char> local_861;
  string local_860;
  allocator<char> local_839;
  string local_838;
  allocator<char> local_811;
  string local_810;
  allocator<char> local_7e9;
  string local_7e8;
  allocator<char> local_7c1;
  string local_7c0;
  allocator<char> local_799;
  string local_798;
  allocator<char> local_771;
  string local_770;
  allocator<char> local_749;
  string local_748;
  allocator<char> local_721;
  string local_720;
  allocator<char> local_6f9;
  string local_6f8;
  allocator<char> local_6d1;
  string local_6d0;
  allocator<char> local_6a9;
  string local_6a8;
  allocator<char> local_681;
  string local_680;
  allocator<char> local_659;
  string local_658;
  allocator<char> local_631;
  string local_630;
  allocator<char> local_609;
  string local_608;
  allocator<char> local_5e1;
  string local_5e0;
  allocator<char> local_5b9;
  string local_5b8;
  allocator<char> local_591;
  string local_590;
  allocator<char> local_569;
  string local_568;
  allocator<char> local_541;
  string local_540;
  allocator<char> local_519;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  allocator<char> local_4a1;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  allocator<char> local_451;
  string local_450;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  string local_400;
  allocator<char> local_3d9;
  string local_3d8;
  allocator<char> local_3b1;
  string local_3b0;
  allocator<char> local_389;
  string local_388;
  allocator<char> local_361;
  string local_360;
  allocator<char> local_339;
  string local_338;
  allocator<char> local_311;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  undefined1 local_110 [8];
  anon_class_24_3_0d5b69a6 initPropValue;
  anon_class_24_3_0d5b69a6 initProp;
  string defKey;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  string *systemName;
  string local_60;
  PerConfig local_2c;
  cmMakefile *pcStack_28;
  PerConfig perConfig_local;
  cmMakefile *mf_local;
  Visibility vis_local;
  TargetType type_local;
  string *name_local;
  cmTarget *this_local;
  
  local_2c = perConfig;
  pcStack_28 = mf;
  mf_local._0_4_ = vis;
  mf_local._4_4_ = type;
  _vis_local = name;
  name_local = (string *)this;
  std::make_unique<cmTargetInternals>();
  TVar7 = mf_local._4_4_;
  if (pcStack_28 == (cmMakefile *)0x0) {
    __assert_fail("mf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmTarget.cxx"
                  ,0x1c1,
                  "cmTarget::cmTarget(const std::string &, cmStateEnums::TargetType, Visibility, cmMakefile *, PerConfig)"
                 );
  }
  pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  pcVar1 = pcStack_28;
  pcVar9->TargetType = TVar7;
  pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  psVar10 = _vis_local;
  pcVar9->Makefile = pcVar1;
  pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  std::__cxx11::string::operator=((string *)&pcVar9->Name,(string *)psVar10);
  pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  pcVar9->IsGeneratorProvided = false;
  pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  pcVar9->HaveInstallRule = false;
  pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  pcVar9->IsDLLPlatform = false;
  pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  pcVar9->IsAIX = false;
  pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  pcVar9->IsAndroid = false;
  local_1d45 = (Visibility)mf_local == VisibilityImported ||
               (Visibility)mf_local == VisibilityImportedGlobally;
  pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  VVar3 = (Visibility)mf_local;
  pcVar9->IsImportedTarget = local_1d45;
  pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  pcVar9->ImportedGloballyVisible = VVar3 == VisibilityImportedGlobally;
  pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  PVar2 = local_2c;
  pcVar9->BuildInterfaceIncludesAppended = false;
  pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  pcVar9->PerConfig = PVar2 == Yes;
  pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  pcVar1 = pcVar9->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"CMAKE_IMPORT_LIBRARY_SUFFIX",
             (allocator<char> *)((long)&systemName + 7));
  cmMakefile::GetSafeDefinition(pcVar1,&local_60);
  bVar4 = std::__cxx11::string::empty();
  pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  pcVar9->IsDLLPlatform = (bool)(bVar4 ^ 1);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)((long)&systemName + 7));
  pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  pcVar1 = pcVar9->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"CMAKE_SYSTEM_NAME",&local_91);
  psVar10 = cmMakefile::GetSafeDefinition(pcVar1,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  local_70 = psVar10;
  bVar5 = std::operator==(psVar10,"AIX");
  local_1d92 = true;
  if (!bVar5) {
    local_1d92 = std::operator==(local_70,"OS400");
  }
  pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  pcVar9->IsAIX = local_1d92;
  pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  pcVar1 = pcVar9->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"CMAKE_SYSTEM_NAME",
             (allocator<char> *)(defKey.field_2._M_local_buf + 0xf));
  psVar10 = cmMakefile::GetSafeDefinition(pcVar1,&local_b8);
  bVar5 = std::operator==(psVar10,"Android");
  pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  pcVar9->IsAndroid = bVar5;
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)(defKey.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)&initProp.defKey);
  std::__cxx11::string::reserve((ulong)&initProp.defKey);
  std::__cxx11::string::operator+=((string *)&initProp.defKey,"CMAKE_");
  initProp.this = (cmTarget *)pcStack_28;
  initPropValue.mf = (cmMakefile *)&initProp.defKey;
  initPropValue.this = (cmTarget *)pcStack_28;
  local_110 = (undefined1  [8])this;
  initPropValue.defKey = (string *)this;
  initProp.mf = initPropValue.mf;
  bVar5 = CanCompileSources(this);
  if (bVar5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"C_COMPILER_LAUNCHER",&local_131);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator(&local_131);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"C_STANDARD",&local_159)
    ;
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator(&local_159);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_180,"C_STANDARD_REQUIRED",&local_181);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator(&local_181);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,"C_EXTENSIONS",&local_1a9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator(&local_1a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"C_VISIBILITY_PRESET",&local_1d1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,"OBJC_COMPILER_LAUNCHER",&local_1f9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,"OBJC_STANDARD",&local_221);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator(&local_221);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,"OBJC_STANDARD_REQUIRED",&local_249);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator(&local_249);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,"OBJC_EXTENSIONS",&local_271);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator(&local_271);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,"OBJC_VISIBILITY_PRESET",&local_299);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator(&local_299);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,"CXX_COMPILER_LAUNCHER",&local_2c1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::allocator<char>::~allocator(&local_2c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e8,"CXX_STANDARD",&local_2e9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::allocator<char>::~allocator(&local_2e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_310,"CXX_STANDARD_REQUIRED",&local_311);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_310);
    std::__cxx11::string::~string((string *)&local_310);
    std::allocator<char>::~allocator(&local_311);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_338,"CXX_EXTENSIONS",&local_339);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_338);
    std::__cxx11::string::~string((string *)&local_338);
    std::allocator<char>::~allocator(&local_339);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,"CXX_VISIBILITY_PRESET",&local_361);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    std::allocator<char>::~allocator(&local_361);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_388,"OBJCXX_COMPILER_LAUNCHER",&local_389);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_388);
    std::__cxx11::string::~string((string *)&local_388);
    std::allocator<char>::~allocator(&local_389);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b0,"OBJCXX_STANDARD",&local_3b1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_3b0);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::allocator<char>::~allocator(&local_3b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3d8,"OBJCXX_STANDARD_REQUIRED",&local_3d9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_3d8);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::allocator<char>::~allocator(&local_3d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_400,"OBJCXX_EXTENSIONS",&local_401);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_400);
    std::__cxx11::string::~string((string *)&local_400);
    std::allocator<char>::~allocator(&local_401);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_428,"OBJCXX_VISIBILITY_PRESET",&local_429);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_428);
    std::__cxx11::string::~string((string *)&local_428);
    std::allocator<char>::~allocator(&local_429);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_450,"CUDA_COMPILER_LAUNCHER",&local_451);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_450);
    std::__cxx11::string::~string((string *)&local_450);
    std::allocator<char>::~allocator(&local_451);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_478,"CUDA_STANDARD",&local_479);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_478);
    std::__cxx11::string::~string((string *)&local_478);
    std::allocator<char>::~allocator(&local_479);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4a0,"CUDA_STANDARD_REQUIRED",&local_4a1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_4a0);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::allocator<char>::~allocator(&local_4a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4c8,"CUDA_EXTENSIONS",&local_4c9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_4c8);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::allocator<char>::~allocator(&local_4c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4f0,"CUDA_VISIBILITY_PRESET",&local_4f1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_4f0);
    std::__cxx11::string::~string((string *)&local_4f0);
    std::allocator<char>::~allocator(&local_4f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_518,"HIP_COMPILER_LAUNCHER",&local_519);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_518);
    std::__cxx11::string::~string((string *)&local_518);
    std::allocator<char>::~allocator(&local_519);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_540,"HIP_STANDARD",&local_541);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_540);
    std::__cxx11::string::~string((string *)&local_540);
    std::allocator<char>::~allocator(&local_541);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_568,"HIP_STANDARD_REQUIRED",&local_569);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_568);
    std::__cxx11::string::~string((string *)&local_568);
    std::allocator<char>::~allocator(&local_569);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_590,"HIP_EXTENSIONS",&local_591);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_590);
    std::__cxx11::string::~string((string *)&local_590);
    std::allocator<char>::~allocator(&local_591);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5b8,"HIP_VISIBILITY_PRESET",&local_5b9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_5b8);
    std::__cxx11::string::~string((string *)&local_5b8);
    std::allocator<char>::~allocator(&local_5b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5e0,"ANDROID_API",&local_5e1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_5e0);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::allocator<char>::~allocator(&local_5e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_608,"ANDROID_API_MIN",&local_609);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_608);
    std::__cxx11::string::~string((string *)&local_608);
    std::allocator<char>::~allocator(&local_609);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_630,"ANDROID_ARCH",&local_631);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_630);
    std::__cxx11::string::~string((string *)&local_630);
    std::allocator<char>::~allocator(&local_631);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_658,"ANDROID_STL_TYPE",&local_659);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_658);
    std::__cxx11::string::~string((string *)&local_658);
    std::allocator<char>::~allocator(&local_659);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_680,"ANDROID_SKIP_ANT_STEP",&local_681);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_680);
    std::__cxx11::string::~string((string *)&local_680);
    std::allocator<char>::~allocator(&local_681);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6a8,"ANDROID_PROCESS_MAX",&local_6a9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_6a8);
    std::__cxx11::string::~string((string *)&local_6a8);
    std::allocator<char>::~allocator(&local_6a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6d0,"ANDROID_PROGUARD",&local_6d1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_6d0);
    std::__cxx11::string::~string((string *)&local_6d0);
    std::allocator<char>::~allocator(&local_6d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6f8,"ANDROID_PROGUARD_CONFIG_PATH",&local_6f9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_6f8);
    std::__cxx11::string::~string((string *)&local_6f8);
    std::allocator<char>::~allocator(&local_6f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_720,"ANDROID_SECURE_PROPS_PATH",&local_721);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_720);
    std::__cxx11::string::~string((string *)&local_720);
    std::allocator<char>::~allocator(&local_721);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_748,"ANDROID_NATIVE_LIB_DIRECTORIES",&local_749);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_748);
    std::__cxx11::string::~string((string *)&local_748);
    std::allocator<char>::~allocator(&local_749);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_770,"ANDROID_NATIVE_LIB_DEPENDENCIES",&local_771);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_770);
    std::__cxx11::string::~string((string *)&local_770);
    std::allocator<char>::~allocator(&local_771);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_798,"ANDROID_JAVA_SOURCE_DIR",&local_799);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_798);
    std::__cxx11::string::~string((string *)&local_798);
    std::allocator<char>::~allocator(&local_799);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7c0,"ANDROID_JAR_DIRECTORIES",&local_7c1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_7c0);
    std::__cxx11::string::~string((string *)&local_7c0);
    std::allocator<char>::~allocator(&local_7c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7e8,"ANDROID_JAR_DEPENDENCIES",&local_7e9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_7e8);
    std::__cxx11::string::~string((string *)&local_7e8);
    std::allocator<char>::~allocator(&local_7e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_810,"ANDROID_ASSETS_DIRECTORIES",&local_811);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_810);
    std::__cxx11::string::~string((string *)&local_810);
    std::allocator<char>::~allocator(&local_811);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_838,"ANDROID_ANT_ADDITIONAL_OPTIONS",&local_839);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_838);
    std::__cxx11::string::~string((string *)&local_838);
    std::allocator<char>::~allocator(&local_839);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_860,"BUILD_RPATH",&local_861);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_860);
    std::__cxx11::string::~string((string *)&local_860);
    std::allocator<char>::~allocator(&local_861);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_888,"BUILD_RPATH_USE_ORIGIN",&local_889);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_888);
    std::__cxx11::string::~string((string *)&local_888);
    std::allocator<char>::~allocator(&local_889);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8b0,"INSTALL_NAME_DIR",&local_8b1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_8b0);
    std::__cxx11::string::~string((string *)&local_8b0);
    std::allocator<char>::~allocator(&local_8b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8d8,"INSTALL_REMOVE_ENVIRONMENT_RPATH",&local_8d9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_8d8);
    std::__cxx11::string::~string((string *)&local_8d8);
    std::allocator<char>::~allocator(&local_8d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_900,"INSTALL_RPATH",&local_901);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)local_110,&local_900,"");
    std::__cxx11::string::~string((string *)&local_900);
    std::allocator<char>::~allocator(&local_901);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_928,"INSTALL_RPATH_USE_LINK_PATH",&local_929);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)local_110,&local_928,"OFF");
    std::__cxx11::string::~string((string *)&local_928);
    std::allocator<char>::~allocator(&local_929);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_950,"INTERPROCEDURAL_OPTIMIZATION",&local_951);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_950);
    std::__cxx11::string::~string((string *)&local_950);
    std::allocator<char>::~allocator(&local_951);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_978,"SKIP_BUILD_RPATH",&local_979);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)local_110,&local_978,"OFF");
    std::__cxx11::string::~string((string *)&local_978);
    std::allocator<char>::~allocator(&local_979);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9a0,"BUILD_WITH_INSTALL_RPATH",&local_9a1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)local_110,&local_9a0,"OFF");
    std::__cxx11::string::~string((string *)&local_9a0);
    std::allocator<char>::~allocator(&local_9a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9c8,"ARCHIVE_OUTPUT_DIRECTORY",&local_9c9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_9c8);
    std::__cxx11::string::~string((string *)&local_9c8);
    std::allocator<char>::~allocator(&local_9c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9f0,"LIBRARY_OUTPUT_DIRECTORY",&local_9f1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_9f0);
    std::__cxx11::string::~string((string *)&local_9f0);
    std::allocator<char>::~allocator(&local_9f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a18,"RUNTIME_OUTPUT_DIRECTORY",&local_a19);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_a18);
    std::__cxx11::string::~string((string *)&local_a18);
    std::allocator<char>::~allocator(&local_a19);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a40,"PDB_OUTPUT_DIRECTORY",&local_a41);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_a40);
    std::__cxx11::string::~string((string *)&local_a40);
    std::allocator<char>::~allocator(&local_a41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a68,"COMPILE_PDB_OUTPUT_DIRECTORY",&local_a69);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_a68);
    std::__cxx11::string::~string((string *)&local_a68);
    std::allocator<char>::~allocator(&local_a69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a90,"FRAMEWORK",&local_a91);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_a90);
    std::__cxx11::string::~string((string *)&local_a90);
    std::allocator<char>::~allocator(&local_a91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ab8,"FRAMEWORK_MULTI_CONFIG_POSTFIX",&local_ab9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_ab8);
    std::__cxx11::string::~string((string *)&local_ab8);
    std::allocator<char>::~allocator(&local_ab9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ae0,"Fortran_FORMAT",&local_ae1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_ae0);
    std::__cxx11::string::~string((string *)&local_ae0);
    std::allocator<char>::~allocator(&local_ae1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b08,"Fortran_MODULE_DIRECTORY",&local_b09);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_b08);
    std::__cxx11::string::~string((string *)&local_b08);
    std::allocator<char>::~allocator(&local_b09);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b30,"Fortran_COMPILER_LAUNCHER",&local_b31);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_b30);
    std::__cxx11::string::~string((string *)&local_b30);
    std::allocator<char>::~allocator(&local_b31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b58,"Fortran_PREPROCESS",&local_b59);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_b58);
    std::__cxx11::string::~string((string *)&local_b58);
    std::allocator<char>::~allocator(&local_b59);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b80,"Fortran_VISIBILITY_PRESET",&local_b81);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_b80);
    std::__cxx11::string::~string((string *)&local_b80);
    std::allocator<char>::~allocator(&local_b81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ba8,"GNUtoMS",&local_ba9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_ba8);
    std::__cxx11::string::~string((string *)&local_ba8);
    std::allocator<char>::~allocator(&local_ba9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_bd0,"OSX_ARCHITECTURES",&local_bd1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_bd0);
    std::__cxx11::string::~string((string *)&local_bd0);
    std::allocator<char>::~allocator(&local_bd1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_bf8,"IOS_INSTALL_COMBINED",&local_bf9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_bf8);
    std::__cxx11::string::~string((string *)&local_bf8);
    std::allocator<char>::~allocator(&local_bf9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c20,"AUTOMOC",&local_c21);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_c20);
    std::__cxx11::string::~string((string *)&local_c20);
    std::allocator<char>::~allocator(&local_c21);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c48,"AUTOUIC",&local_c49);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_c48);
    std::__cxx11::string::~string((string *)&local_c48);
    std::allocator<char>::~allocator(&local_c49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c70,"AUTORCC",&local_c71);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_c70);
    std::__cxx11::string::~string((string *)&local_c70);
    std::allocator<char>::~allocator(&local_c71);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c98,"AUTOGEN_ORIGIN_DEPENDS",&local_c99);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_c98);
    std::__cxx11::string::~string((string *)&local_c98);
    std::allocator<char>::~allocator(&local_c99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_cc0,"AUTOGEN_PARALLEL",&local_cc1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_cc0);
    std::__cxx11::string::~string((string *)&local_cc0);
    std::allocator<char>::~allocator(&local_cc1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ce8,"AUTOMOC_COMPILER_PREDEFINES",&local_ce9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_ce8);
    std::__cxx11::string::~string((string *)&local_ce8);
    std::allocator<char>::~allocator(&local_ce9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d10,"AUTOMOC_DEPEND_FILTERS",&local_d11);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_d10);
    std::__cxx11::string::~string((string *)&local_d10);
    std::allocator<char>::~allocator(&local_d11);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d38,"AUTOMOC_MACRO_NAMES",&local_d39);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_d38);
    std::__cxx11::string::~string((string *)&local_d38);
    std::allocator<char>::~allocator(&local_d39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d60,"AUTOMOC_MOC_OPTIONS",&local_d61);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_d60);
    std::__cxx11::string::~string((string *)&local_d60);
    std::allocator<char>::~allocator(&local_d61);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d88,"AUTOUIC_OPTIONS",&local_d89);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_d88);
    std::__cxx11::string::~string((string *)&local_d88);
    std::allocator<char>::~allocator(&local_d89);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_db0,"AUTOMOC_PATH_PREFIX",&local_db1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_db0);
    std::__cxx11::string::~string((string *)&local_db0);
    std::allocator<char>::~allocator(&local_db1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_dd8,"AUTOUIC_SEARCH_PATHS",&local_dd9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_dd8);
    std::__cxx11::string::~string((string *)&local_dd8);
    std::allocator<char>::~allocator(&local_dd9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e00,"AUTORCC_OPTIONS",&local_e01);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_e00);
    std::__cxx11::string::~string((string *)&local_e00);
    std::allocator<char>::~allocator(&local_e01);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e28,"LINK_DEPENDS_NO_SHARED",&local_e29);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_e28);
    std::__cxx11::string::~string((string *)&local_e28);
    std::allocator<char>::~allocator(&local_e29);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e50,"LINK_INTERFACE_LIBRARIES",&local_e51);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_e50);
    std::__cxx11::string::~string((string *)&local_e50);
    std::allocator<char>::~allocator(&local_e51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e78,"MSVC_DEBUG_INFORMATION_FORMAT",&local_e79);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_e78);
    std::__cxx11::string::~string((string *)&local_e78);
    std::allocator<char>::~allocator(&local_e79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ea0,"MSVC_RUNTIME_LIBRARY",&local_ea1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_ea0);
    std::__cxx11::string::~string((string *)&local_ea0);
    std::allocator<char>::~allocator(&local_ea1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ec8,"WATCOM_RUNTIME_LIBRARY",&local_ec9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_ec8);
    std::__cxx11::string::~string((string *)&local_ec8);
    std::allocator<char>::~allocator(&local_ec9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ef0,"WIN32_EXECUTABLE",&local_ef1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_ef0);
    std::__cxx11::string::~string((string *)&local_ef0);
    std::allocator<char>::~allocator(&local_ef1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f18,"MACOSX_BUNDLE",&local_f19);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_f18);
    std::__cxx11::string::~string((string *)&local_f18);
    std::allocator<char>::~allocator(&local_f19);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f40,"MACOSX_RPATH",&local_f41);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_f40);
    std::__cxx11::string::~string((string *)&local_f40);
    std::allocator<char>::~allocator(&local_f41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f68,"NO_SYSTEM_FROM_IMPORTED",&local_f69);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_f68);
    std::__cxx11::string::~string((string *)&local_f68);
    std::allocator<char>::~allocator(&local_f69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f90,"BUILD_WITH_INSTALL_NAME_DIR",&local_f91);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_f90);
    std::__cxx11::string::~string((string *)&local_f90);
    std::allocator<char>::~allocator(&local_f91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_fb8,"C_CLANG_TIDY",&local_fb9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_fb8);
    std::__cxx11::string::~string((string *)&local_fb8);
    std::allocator<char>::~allocator(&local_fb9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_fe0,"C_CPPLINT",&local_fe1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_fe0);
    std::__cxx11::string::~string((string *)&local_fe0);
    std::allocator<char>::~allocator(&local_fe1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1008,"C_CPPCHECK",&local_1009);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1008);
    std::__cxx11::string::~string((string *)&local_1008);
    std::allocator<char>::~allocator(&local_1009);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1030,"C_INCLUDE_WHAT_YOU_USE",&local_1031);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1030);
    std::__cxx11::string::~string((string *)&local_1030);
    std::allocator<char>::~allocator(&local_1031);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1058,"C_LINKER_LAUNCHER",&local_1059);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1058);
    std::__cxx11::string::~string((string *)&local_1058);
    std::allocator<char>::~allocator(&local_1059);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1080,"LINK_WHAT_YOU_USE",&local_1081);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1080);
    std::__cxx11::string::~string((string *)&local_1080);
    std::allocator<char>::~allocator(&local_1081);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_10a8,"CXX_CLANG_TIDY",&local_10a9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_10a8);
    std::__cxx11::string::~string((string *)&local_10a8);
    std::allocator<char>::~allocator(&local_10a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_10d0,"CXX_CPPLINT",&local_10d1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_10d0);
    std::__cxx11::string::~string((string *)&local_10d0);
    std::allocator<char>::~allocator(&local_10d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_10f8,"CXX_CPPCHECK",&local_10f9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_10f8);
    std::__cxx11::string::~string((string *)&local_10f8);
    std::allocator<char>::~allocator(&local_10f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1120,"CXX_INCLUDE_WHAT_YOU_USE",&local_1121);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1120);
    std::__cxx11::string::~string((string *)&local_1120);
    std::allocator<char>::~allocator(&local_1121);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1148,"CXX_LINKER_LAUNCHER",&local_1149);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1148);
    std::__cxx11::string::~string((string *)&local_1148);
    std::allocator<char>::~allocator(&local_1149);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1170,"CUDA_SEPARABLE_COMPILATION",&local_1171);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1170);
    std::__cxx11::string::~string((string *)&local_1170);
    std::allocator<char>::~allocator(&local_1171);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1198,"CUDA_RESOLVE_DEVICE_SYMBOLS",&local_1199);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1198);
    std::__cxx11::string::~string((string *)&local_1198);
    std::allocator<char>::~allocator(&local_1199);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_11c0,"CUDA_RUNTIME_LIBRARY",&local_11c1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_11c0);
    std::__cxx11::string::~string((string *)&local_11c0);
    std::allocator<char>::~allocator(&local_11c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_11e8,"CUDA_ARCHITECTURES",&local_11e9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_11e8);
    std::__cxx11::string::~string((string *)&local_11e8);
    std::allocator<char>::~allocator(&local_11e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1210,"HIP_RUNTIME_LIBRARY",&local_1211);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1210);
    std::__cxx11::string::~string((string *)&local_1210);
    std::allocator<char>::~allocator(&local_1211);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1238,"HIP_ARCHITECTURES",&local_1239);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1238);
    std::__cxx11::string::~string((string *)&local_1238);
    std::allocator<char>::~allocator(&local_1239);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1260,"VISIBILITY_INLINES_HIDDEN",&local_1261);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1260);
    std::__cxx11::string::~string((string *)&local_1260);
    std::allocator<char>::~allocator(&local_1261);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1288,"JOB_POOL_COMPILE",&local_1289);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1288);
    std::__cxx11::string::~string((string *)&local_1288);
    std::allocator<char>::~allocator(&local_1289);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_12b0,"JOB_POOL_LINK",&local_12b1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_12b0);
    std::__cxx11::string::~string((string *)&local_12b0);
    std::allocator<char>::~allocator(&local_12b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_12d8,"JOB_POOL_PRECOMPILE_HEADER",&local_12d9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_12d8);
    std::__cxx11::string::~string((string *)&local_12d8);
    std::allocator<char>::~allocator(&local_12d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1300,"ISPC_COMPILER_LAUNCHER",&local_1301);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1300);
    std::__cxx11::string::~string((string *)&local_1300);
    std::allocator<char>::~allocator(&local_1301);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1328,"ISPC_HEADER_DIRECTORY",&local_1329);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1328);
    std::__cxx11::string::~string((string *)&local_1328);
    std::allocator<char>::~allocator(&local_1329);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1350,"ISPC_HEADER_SUFFIX",&local_1351);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)local_110,&local_1350,"_ispc.h");
    std::__cxx11::string::~string((string *)&local_1350);
    std::allocator<char>::~allocator(&local_1351);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1378,"ISPC_INSTRUCTION_SETS",&local_1379);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1378);
    std::__cxx11::string::~string((string *)&local_1378);
    std::allocator<char>::~allocator(&local_1379);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_13a0,"LINK_SEARCH_START_STATIC",&local_13a1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_13a0);
    std::__cxx11::string::~string((string *)&local_13a0);
    std::allocator<char>::~allocator(&local_13a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_13c8,"LINK_SEARCH_END_STATIC",&local_13c9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_13c8);
    std::__cxx11::string::~string((string *)&local_13c8);
    std::allocator<char>::~allocator(&local_13c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_13f0,"OBJC_CLANG_TIDY",&local_13f1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_13f0);
    std::__cxx11::string::~string((string *)&local_13f0);
    std::allocator<char>::~allocator(&local_13f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1418,"OBJC_LINKER_LAUNCHER",&local_1419);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1418);
    std::__cxx11::string::~string((string *)&local_1418);
    std::allocator<char>::~allocator(&local_1419);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1440,"OBJCXX_CLANG_TIDY",&local_1441);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1440);
    std::__cxx11::string::~string((string *)&local_1440);
    std::allocator<char>::~allocator(&local_1441);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1468,"OBJCXX_LINKER_LAUNCHER",&local_1469);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1468);
    std::__cxx11::string::~string((string *)&local_1468);
    std::allocator<char>::~allocator(&local_1469);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1490,"Swift_LANGUAGE_VERSION",&local_1491);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1490);
    std::__cxx11::string::~string((string *)&local_1490);
    std::allocator<char>::~allocator(&local_1491);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_14b8,"Swift_MODULE_DIRECTORY",&local_14b9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_14b8);
    std::__cxx11::string::~string((string *)&local_14b8);
    std::allocator<char>::~allocator(&local_14b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_14e0,"VS_JUST_MY_CODE_DEBUGGING",&local_14e1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_14e0);
    std::__cxx11::string::~string((string *)&local_14e0);
    std::allocator<char>::~allocator(&local_14e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1508,"VS_NO_COMPILE_BATCHING",&local_1509);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1508);
    std::__cxx11::string::~string((string *)&local_1508);
    std::allocator<char>::~allocator(&local_1509);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1530,"DISABLE_PRECOMPILE_HEADERS",&local_1531);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1530);
    std::__cxx11::string::~string((string *)&local_1530);
    std::allocator<char>::~allocator(&local_1531);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1558,"UNITY_BUILD",&local_1559);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1558);
    std::__cxx11::string::~string((string *)&local_1558);
    std::allocator<char>::~allocator(&local_1559);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1580,"UNITY_BUILD_UNIQUE_ID",&local_1581);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1580);
    std::__cxx11::string::~string((string *)&local_1580);
    std::allocator<char>::~allocator(&local_1581);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_15a8,"OPTIMIZE_DEPENDENCIES",&local_15a9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_15a8);
    std::__cxx11::string::~string((string *)&local_15a8);
    std::allocator<char>::~allocator(&local_15a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_15d0,"EXPORT_COMPILE_COMMANDS",&local_15d1);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_15d0);
    std::__cxx11::string::~string((string *)&local_15d0);
    std::allocator<char>::~allocator(&local_15d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_15f8,"COMPILE_WARNING_AS_ERROR",&local_15f9);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_15f8);
    std::__cxx11::string::~string((string *)&local_15f8);
    std::allocator<char>::~allocator(&local_15f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1620,"UNITY_BUILD_BATCH_SIZE",&local_1621);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)local_110,&local_1620,"8");
    std::__cxx11::string::~string((string *)&local_1620);
    std::allocator<char>::~allocator(&local_1621);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1648,"UNITY_BUILD_MODE",&local_1649);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)local_110,&local_1648,"BATCH");
    std::__cxx11::string::~string((string *)&local_1648);
    std::allocator<char>::~allocator(&local_1649);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1670,"PCH_WARN_INVALID",&local_1671);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)local_110,&local_1670,"ON");
    std::__cxx11::string::~string((string *)&local_1670);
    std::allocator<char>::~allocator(&local_1671);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1698,"PCH_INSTANTIATE_TEMPLATES",&local_1699);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)local_110,&local_1698,"ON");
    std::__cxx11::string::~string((string *)&local_1698);
    std::allocator<char>::~allocator(&local_1699);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_16c0,"FOLDER",&local_16c1);
  cmTarget::anon_class_24_3_0d5b69a6::operator()
            ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_16c0);
  std::__cxx11::string::~string((string *)&local_16c0);
  std::allocator<char>::~allocator(&local_16c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_16e8,"VERIFY_INTERFACE_HEADER_SETS",&local_16e9);
  cmTarget::anon_class_24_3_0d5b69a6::operator()
            ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_16e8);
  std::__cxx11::string::~string((string *)&local_16e8);
  std::allocator<char>::~allocator(&local_16e9);
  pcVar11 = GetGlobalGenerator(this);
  uVar6 = (*pcVar11->_vptr_cmGlobalGenerator[0x27])();
  if ((uVar6 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1710,"XCODE_GENERATE_SCHEME",
               (allocator<char> *)
               ((long)&configNames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1710);
    std::__cxx11::string::~string((string *)&local_1710);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&configNames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  TVar7 = GetType(this);
  if ((TVar7 != UTILITY) && (TVar7 = GetType(this), TVar7 != GLOBAL_TARGET)) {
    cmMakefile::GetGeneratorConfigs_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range2,pcStack_28,ExcludeEmptyConfig);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range2);
    configName = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range2);
    while (bVar5 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&configName), bVar5) {
      configUpper.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2);
      cmsys::SystemTools::UpperCase((string *)&__range3,(string *)configUpper.field_2._8_8_);
      __end3 = std::initializer_list<const_char_*>::begin(&cmTarget::configProps);
      ppcVar12 = std::initializer_list<const_char_*>::end(&cmTarget::configProps);
      for (; __end3 != ppcVar12; __end3 = __end3 + 1) {
        property.field_2._8_8_ = __end3;
        pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        if ((pcVar9->TargetType != INTERFACE_LIBRARY) ||
           (iVar8 = strcmp(*(char **)property.field_2._8_8_,"MAP_IMPORTED_CONFIG_"), iVar8 == 0)) {
          cmAlphaNum::cmAlphaNum(&local_17e0,*(char **)property.field_2._8_8_);
          cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&property_1.field_2 + 8),(string *)&__range3);
          cmStrCat<>((string *)local_17b0,&local_17e0,(cmAlphaNum *)((long)&property_1.field_2 + 8))
          ;
          cmTarget::anon_class_24_3_0d5b69a6::operator()
                    ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,(string *)local_17b0);
          std::__cxx11::string::~string((string *)local_17b0);
        }
      }
      pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      if ((pcVar9->TargetType != EXECUTABLE) &&
         (pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                   operator->(&this->impl), pcVar9->TargetType != INTERFACE_LIBRARY)) {
        cmsys::SystemTools::UpperCase(&local_1880,(string *)configUpper.field_2._8_8_);
        cmAlphaNum::cmAlphaNum(&local_1860,&local_1880);
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&property_2.field_2 + 8),"_POSTFIX");
        cmStrCat<>((string *)local_1830,&local_1860,(cmAlphaNum *)((long)&property_2.field_2 + 8));
        std::__cxx11::string::~string((string *)&local_1880);
        cmTarget::anon_class_24_3_0d5b69a6::operator()
                  ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,(string *)local_1830);
        std::__cxx11::string::~string((string *)local_1830);
      }
      pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      if ((pcVar9->TargetType == SHARED_LIBRARY) ||
         (pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                   operator->(&this->impl), pcVar9->TargetType == STATIC_LIBRARY)) {
        cmAlphaNum::cmAlphaNum(&local_1900,"FRAMEWORK_MULTI_CONFIG_POSTFIX_");
        cmsys::SystemTools::UpperCase(&local_1950,(string *)configUpper.field_2._8_8_);
        cmAlphaNum::cmAlphaNum(&local_1930,&local_1950);
        cmStrCat<>((string *)local_18d0,&local_1900,&local_1930);
        std::__cxx11::string::~string((string *)&local_1950);
        cmTarget::anon_class_24_3_0d5b69a6::operator()
                  ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,(string *)local_18d0);
        std::__cxx11::string::~string((string *)local_18d0);
      }
      std::__cxx11::string::~string((string *)&__range3);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    bVar5 = IsImported(this);
    if (!bVar5) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1970,"LINK_LIBRARIES_ONLY_TARGETS",
                 (allocator<char> *)(local_1988 + 0x17));
      cmTarget::anon_class_24_3_0d5b69a6::operator()
                ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1970);
      std::__cxx11::string::~string((string *)&local_1970);
      std::allocator<char>::~allocator((allocator<char> *)(local_1988 + 0x17));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2);
  }
  std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
            (&this->impl);
  cmMakefile::GetBacktrace((cmMakefile *)local_1988);
  pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  cmListFileBacktrace::operator=(&pcVar9->Backtrace,(cmListFileBacktrace *)local_1988);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_1988);
  bVar5 = IsImported(this);
  if (!bVar5) {
    pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    pcVar13 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
              operator->(&this->impl);
    cVar16 = cmMakefile::GetIncludeDirectoriesEntries_abi_cxx11_(pcVar13->Makefile);
    local_1990 = cVar16.End._M_current;
    sysInc = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)cVar16.Begin._M_current;
    ::cm::
    append<std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_0>
              (&pcVar9->IncludeDirectoriesEntries,
               (cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                *)&sysInc);
    pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    local_19a0 = cmMakefile::GetSystemIncludeDirectories_abi_cxx11_(pcVar9->Makefile);
    pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    local_19a8._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(local_19a0);
    local_19b0 = (_Base_ptr)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(local_19a0);
    std::
    set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
    insert<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&pcVar9->SystemIncludeDirectories,local_19a8,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_19b0);
    pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    pcVar13 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
              operator->(&this->impl);
    local_19c0 = cmMakefile::GetCompileOptionsEntries_abi_cxx11_(pcVar13->Makefile);
    ::cm::
    append<std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_0>
              (&pcVar9->CompileOptionsEntries,&local_19c0);
    pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    pcVar13 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
              operator->(&this->impl);
    local_19d0 = cmMakefile::GetLinkOptionsEntries_abi_cxx11_(pcVar13->Makefile);
    ::cm::
    append<std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_0>
              (&pcVar9->LinkOptionsEntries,&local_19d0);
    pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    pcVar13 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
              operator->(&this->impl);
    local_19e0 = cmMakefile::GetLinkDirectoriesEntries_abi_cxx11_(pcVar13->Makefile);
    ::cm::
    append<std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_0>
              (&pcVar9->LinkDirectoriesEntries,&local_19e0);
  }
  pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  if (pcVar9->TargetType == EXECUTABLE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a00,"ANDROID_GUI",&local_1a01);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1a00);
    std::__cxx11::string::~string((string *)&local_1a00);
    std::allocator<char>::~allocator(&local_1a01);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a28,"CROSSCOMPILING_EMULATOR",&local_1a29);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1a28);
    std::__cxx11::string::~string((string *)&local_1a28);
    std::allocator<char>::~allocator(&local_1a29);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a50,"ENABLE_EXPORTS",&local_1a51);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1a50);
    std::__cxx11::string::~string((string *)&local_1a50);
    std::allocator<char>::~allocator(&local_1a51);
  }
  pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  if (pcVar9->TargetType == SHARED_LIBRARY) {
LAB_007828b1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a78,"POSITION_INDEPENDENT_CODE",&local_1a79);
    SetProperty(this,&local_1a78,"True");
    std::__cxx11::string::~string((string *)&local_1a78);
    std::allocator<char>::~allocator(&local_1a79);
  }
  else {
    pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    if (pcVar9->TargetType == MODULE_LIBRARY) goto LAB_007828b1;
    bVar5 = CanCompileSources(this);
    if (bVar5) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1aa0,"POSITION_INDEPENDENT_CODE",&local_1aa1);
      cmTarget::anon_class_24_3_0d5b69a6::operator()
                ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1aa0);
      std::__cxx11::string::~string((string *)&local_1aa0);
      std::allocator<char>::~allocator(&local_1aa1);
    }
  }
  pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  if (pcVar9->TargetType != SHARED_LIBRARY) {
    pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    if (pcVar9->TargetType != EXECUTABLE) goto LAB_00782b58;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1ac8,"AIX_EXPORT_ALL_SYMBOLS",&local_1ac9);
  cmTarget::anon_class_24_3_0d5b69a6::operator()
            ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1ac8);
  std::__cxx11::string::~string((string *)&local_1ac8);
  std::allocator<char>::~allocator(&local_1ac9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1af0,"WINDOWS_EXPORT_ALL_SYMBOLS",&local_1af1);
  cmTarget::anon_class_24_3_0d5b69a6::operator()
            ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1af0);
  std::__cxx11::string::~string((string *)&local_1af0);
  std::allocator<char>::~allocator(&local_1af1);
LAB_00782b58:
  pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  pcVar1 = pcVar9->Makefile;
  pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  cmMakefile::RecordPolicies(pcVar1,&pcVar9->PolicyMap);
  pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  if (pcVar9->TargetType == INTERFACE_LIBRARY) {
    pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    cmPolicies::PolicyMap::Set(&pcVar9->PolicyMap,CMP0022,NEW);
  }
  bVar5 = IsImported(this);
  if (!bVar5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b18,"DOTNET_SDK",&local_1b19);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1b18);
    std::__cxx11::string::~string((string *)&local_1b18);
    std::allocator<char>::~allocator(&local_1b19);
  }
  pcVar9 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  if ((int)pcVar9->TargetType < 7) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b40,"DOTNET_TARGET_FRAMEWORK",&local_1b41);
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1b40);
    std::__cxx11::string::~string((string *)&local_1b40);
    std::allocator<char>::~allocator(&local_1b41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b68,"DOTNET_TARGET_FRAMEWORK_VERSION",
               (allocator<char> *)((long)&globals.Value + 7));
    cmTarget::anon_class_24_3_0d5b69a6::operator()
              ((anon_class_24_3_0d5b69a6 *)&initPropValue.defKey,&local_1b68);
    std::__cxx11::string::~string((string *)&local_1b68);
    std::allocator<char>::~allocator((allocator<char> *)((long)&globals.Value + 7));
  }
  pcVar1 = pcStack_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b98,"CMAKE_VS_GLOBALS",
             (allocator<char> *)(genName.field_2._M_local_buf + 0xf));
  local_1b78 = cmMakefile::GetDefinition(pcVar1,&local_1b98);
  std::__cxx11::string::~string((string *)&local_1b98);
  std::allocator<char>::~allocator((allocator<char> *)(genName.field_2._M_local_buf + 0xf));
  bVar5 = cmValue::operator_cast_to_bool(&local_1b78);
  if (bVar5) {
    pcVar11 = cmMakefile::GetGlobalGenerator(pcStack_28);
    (*pcVar11->_vptr_cmGlobalGenerator[3])(local_1bc0);
    sVar17 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_1bc0);
    props.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)sVar17._M_len;
    bVar5 = cmHasLiteralPrefix<14ul>(sVar17,(char (*) [14])"Visual Studio");
    if (bVar5) {
      psVar10 = cmValue::operator*[abi_cxx11_(&local_1b78);
      sVar17 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar10);
      vsGlobal.field_2._8_8_ = sVar17._M_len;
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1be8,sVar17,false);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1c18,"VS_GLOBAL_",(allocator<char> *)((long)&__range3_1 + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range3_1 + 7));
      __end3_1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_1be8);
      i = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1be8);
      while( true ) {
        bVar5 = __gnu_cxx::operator!=
                          (&__end3_1,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&i);
        if (!bVar5) break;
        pbVar14 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end3_1);
        propName.field_2._8_8_ = std::__cxx11::string::find((char)pbVar14,0x3d);
        if (propName.field_2._8_8_ != -1) {
          std::__cxx11::string::substr((ulong)((long)&propValue.field_2 + 8),(ulong)pbVar14);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1c68,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1c18,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&propValue.field_2 + 8));
          std::__cxx11::string::~string((string *)(propValue.field_2._M_local_buf + 8));
          std::__cxx11::string::substr((ulong)local_1ca8,(ulong)pbVar14);
          default_value = (char *)std::__cxx11::string::c_str();
          cmTarget::anon_class_24_3_0d5b69a6::operator()
                    ((anon_class_24_3_0d5b69a6 *)local_110,(string *)local_1c68,default_value);
          std::__cxx11::string::~string(local_1ca8);
          std::__cxx11::string::~string((string *)local_1c68);
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3_1);
      }
      std::__cxx11::string::~string((string *)local_1c18);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1be8);
    }
    std::__cxx11::string::~string(local_1bc0);
  }
  local_1cca = 0;
  local_1ccb = 0;
  bVar5 = IsImported(this);
  pcVar1 = pcStack_28;
  local_237a = true;
  if (!bVar5) {
    std::allocator<char>::allocator();
    local_1cca = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1cc8,"SYSTEM",&local_1cc9);
    local_1ccb = 1;
    local_237a = cmMakefile::GetPropertyAsBool(pcVar1,&local_1cc8);
  }
  if ((local_1ccb & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1cc8);
  }
  if ((local_1cca & 1) != 0) {
    std::allocator<char>::~allocator(&local_1cc9);
  }
  if (local_237a != false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1cf0,"SYSTEM",(allocator<char> *)((long)&__range1 + 7));
    SetProperty(this,&local_1cf0,"ON");
    std::__cxx11::string::~string((string *)&local_1cf0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  }
  this_00 = cmMakefile::GetState(pcStack_28);
  this_01 = cmState::GetPropertyDefinitions(this_00);
  this_02 = cmPropertyDefinitionMap::GetMap_abi_cxx11_(this_01);
  __end1 = std::
           map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>_>
           ::begin(this_02);
  prop_1 = (pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>
            *)std::
              map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>_>
              ::end(this_02);
  while( true ) {
    bVar5 = std::operator!=(&__end1,(_Self *)&prop_1);
    if (!bVar5) break;
    value.Value = (string *)
                  std::
                  _Rb_tree_const_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>
                  ::operator*(&__end1);
    if ((((reference)value.Value)->first).second == TARGET) {
      cmPropertyDefinition::GetInitializeFromVariable_abi_cxx11_(&((reference)value.Value)->second);
      uVar15 = std::__cxx11::string::empty();
      pcVar1 = pcStack_28;
      if ((uVar15 & 1) == 0) {
        psVar10 = cmPropertyDefinition::GetInitializeFromVariable_abi_cxx11_
                            ((cmPropertyDefinition *)&value.Value[1]._M_string_length);
        local_1d20 = cmMakefile::GetDefinition(pcVar1,psVar10);
        bVar5 = cmValue::operator_cast_to_bool(&local_1d20);
        if (bVar5) {
          SetProperty(this,value.Value,local_1d20);
        }
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::~string((string *)&initProp.defKey);
  return;
}

Assistant:

cmTarget::cmTarget(std::string const& name, cmStateEnums::TargetType type,
                   Visibility vis, cmMakefile* mf, PerConfig perConfig)
  : impl(cm::make_unique<cmTargetInternals>())
{
  assert(mf);
  this->impl->TargetType = type;
  this->impl->Makefile = mf;
  this->impl->Name = name;
  this->impl->IsGeneratorProvided = false;
  this->impl->HaveInstallRule = false;
  this->impl->IsDLLPlatform = false;
  this->impl->IsAIX = false;
  this->impl->IsAndroid = false;
  this->impl->IsImportedTarget =
    (vis == VisibilityImported || vis == VisibilityImportedGlobally);
  this->impl->ImportedGloballyVisible = vis == VisibilityImportedGlobally;
  this->impl->BuildInterfaceIncludesAppended = false;
  this->impl->PerConfig = (perConfig == PerConfig::Yes);

  // Check whether this is a DLL platform.
  this->impl->IsDLLPlatform =
    !this->impl->Makefile->GetSafeDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX")
       .empty();

  // Check whether we are targeting AIX.
  {
    std::string const& systemName =
      this->impl->Makefile->GetSafeDefinition("CMAKE_SYSTEM_NAME");
    this->impl->IsAIX = (systemName == "AIX" || systemName == "OS400");
  }

  // Check whether we are targeting an Android platform.
  this->impl->IsAndroid = (this->impl->Makefile->GetSafeDefinition(
                             "CMAKE_SYSTEM_NAME") == "Android");

  std::string defKey;
  defKey.reserve(128);
  defKey += "CMAKE_";
  auto initProp = [this, mf, &defKey](const std::string& property) {
    // Replace everything after "CMAKE_"
    defKey.replace(defKey.begin() + 6, defKey.end(), property);
    if (cmValue value = mf->GetDefinition(defKey)) {
      this->SetProperty(property, value);
    }
  };
  auto initPropValue = [this, mf, &defKey](const std::string& property,
                                           const char* default_value) {
    // Replace everything after "CMAKE_"
    defKey.replace(defKey.begin() + 6, defKey.end(), property);
    if (cmValue value = mf->GetDefinition(defKey)) {
      this->SetProperty(property, value);
    } else if (default_value) {
      this->SetProperty(property, default_value);
    }
  };

  // Setup default property values.
  if (this->CanCompileSources()) {

    SETUP_COMMON_LANGUAGE_PROPERTIES(C);
    SETUP_COMMON_LANGUAGE_PROPERTIES(OBJC);
    SETUP_COMMON_LANGUAGE_PROPERTIES(CXX);
    SETUP_COMMON_LANGUAGE_PROPERTIES(OBJCXX);
    SETUP_COMMON_LANGUAGE_PROPERTIES(CUDA);
    SETUP_COMMON_LANGUAGE_PROPERTIES(HIP);

    initProp("ANDROID_API");
    initProp("ANDROID_API_MIN");
    initProp("ANDROID_ARCH");
    initProp("ANDROID_STL_TYPE");
    initProp("ANDROID_SKIP_ANT_STEP");
    initProp("ANDROID_PROCESS_MAX");
    initProp("ANDROID_PROGUARD");
    initProp("ANDROID_PROGUARD_CONFIG_PATH");
    initProp("ANDROID_SECURE_PROPS_PATH");
    initProp("ANDROID_NATIVE_LIB_DIRECTORIES");
    initProp("ANDROID_NATIVE_LIB_DEPENDENCIES");
    initProp("ANDROID_JAVA_SOURCE_DIR");
    initProp("ANDROID_JAR_DIRECTORIES");
    initProp("ANDROID_JAR_DEPENDENCIES");
    initProp("ANDROID_ASSETS_DIRECTORIES");
    initProp("ANDROID_ANT_ADDITIONAL_OPTIONS");
    initProp("BUILD_RPATH");
    initProp("BUILD_RPATH_USE_ORIGIN");
    initProp("INSTALL_NAME_DIR");
    initProp("INSTALL_REMOVE_ENVIRONMENT_RPATH");
    initPropValue("INSTALL_RPATH", "");
    initPropValue("INSTALL_RPATH_USE_LINK_PATH", "OFF");
    initProp("INTERPROCEDURAL_OPTIMIZATION");
    initPropValue("SKIP_BUILD_RPATH", "OFF");
    initPropValue("BUILD_WITH_INSTALL_RPATH", "OFF");
    initProp("ARCHIVE_OUTPUT_DIRECTORY");
    initProp("LIBRARY_OUTPUT_DIRECTORY");
    initProp("RUNTIME_OUTPUT_DIRECTORY");
    initProp("PDB_OUTPUT_DIRECTORY");
    initProp("COMPILE_PDB_OUTPUT_DIRECTORY");
    initProp("FRAMEWORK");
    initProp("FRAMEWORK_MULTI_CONFIG_POSTFIX");
    initProp("Fortran_FORMAT");
    initProp("Fortran_MODULE_DIRECTORY");
    initProp("Fortran_COMPILER_LAUNCHER");
    initProp("Fortran_PREPROCESS");
    initProp("Fortran_VISIBILITY_PRESET");
    initProp("GNUtoMS");
    initProp("OSX_ARCHITECTURES");
    initProp("IOS_INSTALL_COMBINED");
    initProp("AUTOMOC");
    initProp("AUTOUIC");
    initProp("AUTORCC");
    initProp("AUTOGEN_ORIGIN_DEPENDS");
    initProp("AUTOGEN_PARALLEL");
    initProp("AUTOMOC_COMPILER_PREDEFINES");
    initProp("AUTOMOC_DEPEND_FILTERS");
    initProp("AUTOMOC_MACRO_NAMES");
    initProp("AUTOMOC_MOC_OPTIONS");
    initProp("AUTOUIC_OPTIONS");
    initProp("AUTOMOC_PATH_PREFIX");
    initProp("AUTOUIC_SEARCH_PATHS");
    initProp("AUTORCC_OPTIONS");
    initProp("LINK_DEPENDS_NO_SHARED");
    initProp("LINK_INTERFACE_LIBRARIES");
    initProp("MSVC_DEBUG_INFORMATION_FORMAT");
    initProp("MSVC_RUNTIME_LIBRARY");
    initProp("WATCOM_RUNTIME_LIBRARY");
    initProp("WIN32_EXECUTABLE");
    initProp("MACOSX_BUNDLE");
    initProp("MACOSX_RPATH");
    initProp("NO_SYSTEM_FROM_IMPORTED");
    initProp("BUILD_WITH_INSTALL_NAME_DIR");
    initProp("C_CLANG_TIDY");
    initProp("C_CPPLINT");
    initProp("C_CPPCHECK");
    initProp("C_INCLUDE_WHAT_YOU_USE");
    initProp("C_LINKER_LAUNCHER");
    initProp("LINK_WHAT_YOU_USE");
    initProp("CXX_CLANG_TIDY");
    initProp("CXX_CPPLINT");
    initProp("CXX_CPPCHECK");
    initProp("CXX_INCLUDE_WHAT_YOU_USE");
    initProp("CXX_LINKER_LAUNCHER");
    initProp("CUDA_SEPARABLE_COMPILATION");
    initProp("CUDA_RESOLVE_DEVICE_SYMBOLS");
    initProp("CUDA_RUNTIME_LIBRARY");
    initProp("CUDA_ARCHITECTURES");
    initProp("HIP_RUNTIME_LIBRARY");
    initProp("HIP_ARCHITECTURES");
    initProp("VISIBILITY_INLINES_HIDDEN");
    initProp("JOB_POOL_COMPILE");
    initProp("JOB_POOL_LINK");
    initProp("JOB_POOL_PRECOMPILE_HEADER");
    initProp("ISPC_COMPILER_LAUNCHER");
    initProp("ISPC_HEADER_DIRECTORY");
    initPropValue("ISPC_HEADER_SUFFIX", "_ispc.h");
    initProp("ISPC_INSTRUCTION_SETS");
    initProp("LINK_SEARCH_START_STATIC");
    initProp("LINK_SEARCH_END_STATIC");
    initProp("OBJC_CLANG_TIDY");
    initProp("OBJC_LINKER_LAUNCHER");
    initProp("OBJCXX_CLANG_TIDY");
    initProp("OBJCXX_LINKER_LAUNCHER");
    initProp("Swift_LANGUAGE_VERSION");
    initProp("Swift_MODULE_DIRECTORY");
    initProp("VS_JUST_MY_CODE_DEBUGGING");
    initProp("VS_NO_COMPILE_BATCHING");
    initProp("DISABLE_PRECOMPILE_HEADERS");
    initProp("UNITY_BUILD");
    initProp("UNITY_BUILD_UNIQUE_ID");
    initProp("OPTIMIZE_DEPENDENCIES");
    initProp("EXPORT_COMPILE_COMMANDS");
    initProp("COMPILE_WARNING_AS_ERROR");
    initPropValue("UNITY_BUILD_BATCH_SIZE", "8");
    initPropValue("UNITY_BUILD_MODE", "BATCH");
    initPropValue("PCH_WARN_INVALID", "ON");
    initPropValue("PCH_INSTANTIATE_TEMPLATES", "ON");

#ifdef __APPLE__
    if (this->GetGlobalGenerator()->IsXcode()) {
      initProp("XCODE_SCHEME_ADDRESS_SANITIZER");
      initProp("XCODE_SCHEME_ADDRESS_SANITIZER_USE_AFTER_RETURN");
      initProp("XCODE_SCHEME_DEBUG_DOCUMENT_VERSIONING");
      initProp("XCODE_SCHEME_ENABLE_GPU_FRAME_CAPTURE_MODE");
      initProp("XCODE_SCHEME_THREAD_SANITIZER");
      initProp("XCODE_SCHEME_THREAD_SANITIZER_STOP");
      initProp("XCODE_SCHEME_UNDEFINED_BEHAVIOUR_SANITIZER");
      initProp("XCODE_SCHEME_UNDEFINED_BEHAVIOUR_SANITIZER_STOP");
      initProp("XCODE_SCHEME_LAUNCH_CONFIGURATION");
      initProp("XCODE_SCHEME_ENABLE_GPU_API_VALIDATION");
      initProp("XCODE_SCHEME_ENABLE_GPU_SHADER_VALIDATION");
      initProp("XCODE_SCHEME_WORKING_DIRECTORY");
      initProp("XCODE_SCHEME_DISABLE_MAIN_THREAD_CHECKER");
      initProp("XCODE_SCHEME_MAIN_THREAD_CHECKER_STOP");
      initProp("XCODE_SCHEME_MALLOC_SCRIBBLE");
      initProp("XCODE_SCHEME_MALLOC_GUARD_EDGES");
      initProp("XCODE_SCHEME_GUARD_MALLOC");
      initProp("XCODE_SCHEME_LAUNCH_MODE");
      initProp("XCODE_SCHEME_ZOMBIE_OBJECTS");
      initProp("XCODE_SCHEME_MALLOC_STACK");
      initProp("XCODE_SCHEME_DYNAMIC_LINKER_API_USAGE");
      initProp("XCODE_SCHEME_DYNAMIC_LIBRARY_LOADS");
      initProp("XCODE_SCHEME_ENVIRONMENT");
      initPropValue("XCODE_LINK_BUILD_PHASE_MODE", "NONE");
    }
#endif
  }

  initProp("FOLDER");
  initProp("VERIFY_INTERFACE_HEADER_SETS");

  if (this->GetGlobalGenerator()->IsXcode()) {
    initProp("XCODE_GENERATE_SCHEME");
  }

  // Setup per-configuration property default values.
  if (this->GetType() != cmStateEnums::UTILITY &&
      this->GetType() != cmStateEnums::GLOBAL_TARGET) {
    static const auto configProps = {
      /* clang-format needs this comment to break after the opening brace */
      "ARCHIVE_OUTPUT_DIRECTORY_",     "LIBRARY_OUTPUT_DIRECTORY_",
      "RUNTIME_OUTPUT_DIRECTORY_",     "PDB_OUTPUT_DIRECTORY_",
      "COMPILE_PDB_OUTPUT_DIRECTORY_", "MAP_IMPORTED_CONFIG_",
      "INTERPROCEDURAL_OPTIMIZATION_"
    };
    // Collect the set of configuration types.
    std::vector<std::string> configNames =
      mf->GetGeneratorConfigs(cmMakefile::ExcludeEmptyConfig);
    for (std::string const& configName : configNames) {
      std::string configUpper = cmSystemTools::UpperCase(configName);
      for (auto const& prop : configProps) {
        // Interface libraries have no output locations, so honor only
        // the configuration map.
        if (this->impl->TargetType == cmStateEnums::INTERFACE_LIBRARY &&
            strcmp(prop, "MAP_IMPORTED_CONFIG_") != 0) {
          continue;
        }
        std::string property = cmStrCat(prop, configUpper);
        initProp(property);
      }

      // Initialize per-configuration name postfix property from the
      // variable only for non-executable targets.  This preserves
      // compatibility with previous CMake versions in which executables
      // did not support this variable.  Projects may still specify the
      // property directly.
      if (this->impl->TargetType != cmStateEnums::EXECUTABLE &&
          this->impl->TargetType != cmStateEnums::INTERFACE_LIBRARY) {
        std::string property =
          cmStrCat(cmSystemTools::UpperCase(configName), "_POSTFIX");
        initProp(property);
      }

      if (this->impl->TargetType == cmStateEnums::SHARED_LIBRARY ||
          this->impl->TargetType == cmStateEnums::STATIC_LIBRARY) {
        std::string property = cmStrCat("FRAMEWORK_MULTI_CONFIG_POSTFIX_",
                                        cmSystemTools::UpperCase(configName));
        initProp(property);
      }
    }
    if (!this->IsImported()) {
      initProp("LINK_LIBRARIES_ONLY_TARGETS");
    }
  }

  // Save the backtrace of target construction.
  this->impl->Backtrace = this->impl->Makefile->GetBacktrace();

  if (!this->IsImported()) {
    // Initialize the INCLUDE_DIRECTORIES property based on the current value
    // of the same directory property:
    cm::append(this->impl->IncludeDirectoriesEntries,
               this->impl->Makefile->GetIncludeDirectoriesEntries());

    {
      auto const& sysInc = this->impl->Makefile->GetSystemIncludeDirectories();
      this->impl->SystemIncludeDirectories.insert(sysInc.begin(),
                                                  sysInc.end());
    }

    cm::append(this->impl->CompileOptionsEntries,
               this->impl->Makefile->GetCompileOptionsEntries());

    cm::append(this->impl->LinkOptionsEntries,
               this->impl->Makefile->GetLinkOptionsEntries());

    cm::append(this->impl->LinkDirectoriesEntries,
               this->impl->Makefile->GetLinkDirectoriesEntries());
  }

  if (this->impl->TargetType == cmStateEnums::EXECUTABLE) {
    initProp("ANDROID_GUI");
    initProp("CROSSCOMPILING_EMULATOR");
    initProp("ENABLE_EXPORTS");
  }
  if (this->impl->TargetType == cmStateEnums::SHARED_LIBRARY ||
      this->impl->TargetType == cmStateEnums::MODULE_LIBRARY) {
    this->SetProperty("POSITION_INDEPENDENT_CODE", "True");
  } else if (this->CanCompileSources()) {
    initProp("POSITION_INDEPENDENT_CODE");
  }
  if (this->impl->TargetType == cmStateEnums::SHARED_LIBRARY ||
      this->impl->TargetType == cmStateEnums::EXECUTABLE) {
    initProp("AIX_EXPORT_ALL_SYMBOLS");
    initProp("WINDOWS_EXPORT_ALL_SYMBOLS");
  }

  // Record current policies for later use.
  this->impl->Makefile->RecordPolicies(this->impl->PolicyMap);

  if (this->impl->TargetType == cmStateEnums::INTERFACE_LIBRARY) {
    // This policy is checked in a few conditions. The properties relevant
    // to the policy are always ignored for cmStateEnums::INTERFACE_LIBRARY
    // targets,
    // so ensure that the conditions don't lead to nonsense.
    this->impl->PolicyMap.Set(cmPolicies::CMP0022, cmPolicies::NEW);
  }

  if (!this->IsImported()) {
    initProp("DOTNET_SDK");
  }

  if (this->impl->TargetType <= cmStateEnums::GLOBAL_TARGET) {
    initProp("DOTNET_TARGET_FRAMEWORK");
    initProp("DOTNET_TARGET_FRAMEWORK_VERSION");
  }

  // check for "CMAKE_VS_GLOBALS" variable and set up target properties
  // if any
  cmValue globals = mf->GetDefinition("CMAKE_VS_GLOBALS");
  if (globals) {
    const std::string genName = mf->GetGlobalGenerator()->GetName();
    if (cmHasLiteralPrefix(genName, "Visual Studio")) {
      std::vector<std::string> props = cmExpandedList(*globals);
      const std::string vsGlobal = "VS_GLOBAL_";
      for (const std::string& i : props) {
        // split NAME=VALUE
        const std::string::size_type assignment = i.find('=');
        if (assignment != std::string::npos) {
          const std::string propName = vsGlobal + i.substr(0, assignment);
          const std::string propValue = i.substr(assignment + 1);
          initPropValue(propName, propValue.c_str());
        }
      }
    }
  }

  if (this->IsImported() || mf->GetPropertyAsBool("SYSTEM")) {
    this->SetProperty("SYSTEM", "ON");
  }

  for (auto const& prop : mf->GetState()->GetPropertyDefinitions().GetMap()) {
    if (prop.first.second == cmProperty::TARGET &&
        !prop.second.GetInitializeFromVariable().empty()) {
      if (auto value =
            mf->GetDefinition(prop.second.GetInitializeFromVariable())) {
        this->SetProperty(prop.first.first, value);
      }
    }
  }
}